

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialTxOutByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **asset_string,
              int64_t *value_satoshi,char **value_commitment,char **nonce,char **locking_script,
              char **surjection_proof,char **rangeproof)

{
  bool bVar1;
  undefined8 uVar2;
  int64_t iVar3;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  int64_t *in_R8;
  undefined8 *in_R9;
  Amount AVar4;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ConfidentialValue value;
  ConfidentialTxOutReference ref;
  ConfidentialTransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  char *work_rangeproof;
  char *work_surjection_proof;
  char *work_locking_script;
  char *work_nonce;
  char *work_value_commitment;
  char *work_asset_string;
  ConfidentialTxOutReference *in_stack_fffffffffffffb98;
  ConfidentialTxOutReference *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffbc0;
  bool *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc00;
  ByteData local_3c0;
  string local_3a8;
  ByteData local_388;
  string local_370 [24];
  undefined8 in_stack_fffffffffffffca8;
  _func_int **in_stack_fffffffffffffcb0;
  string local_318;
  ConfidentialNonce local_2f8;
  string local_2d0;
  string local_2b0;
  int64_t local_290;
  undefined1 local_288;
  Amount local_280;
  ConfidentialValue local_270;
  ConfidentialAssetId local_248;
  string local_220;
  ConfidentialTxOutReference local_200;
  ConfidentialTransaction *local_108;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [39];
  byte local_a9;
  long local_a8;
  allocator local_99;
  string local_98 [48];
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined8 *local_38;
  int64_t *local_30;
  undefined8 *local_28;
  uint32_t local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"TransactionData",&local_99);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_a8 = local_18;
  local_a9 = 0;
  cfd::capi::ConvertNetType
            ((int)((ulong)in_stack_fffffffffffffc00 >> 0x20),in_stack_fffffffffffffbf8);
  if (*(long *)(local_a8 + 0x18) == 0) {
    local_d2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Invalid handle state. tx is null",&local_d1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbc0,error_code,in_stack_fffffffffffffbb0);
    local_d2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_a9 & 1) != 0) {
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Invalid handle state. tx is bitcoin.",&local_f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbc0,error_code,in_stack_fffffffffffffbb0);
    local_fa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_108 = *(ConfidentialTransaction **)(local_a8 + 0x18);
  cfd::core::ConfidentialTransaction::GetTxOut(&local_200,local_108,local_1c);
  if (local_28 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxOutReference::GetAsset(&local_248,&local_200);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_220,&local_248);
    local_40 = cfd::capi::CreateString(in_stack_fffffffffffffc00);
    std::__cxx11::string::~string((string *)&local_220);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5bdcc2);
  }
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_fffffffffffffb98);
  if (local_30 != (int64_t *)0x0) {
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_270);
    if (!bVar1) {
      AVar4 = cfd::core::ConfidentialValue::GetAmount(&local_270);
      local_290 = AVar4.amount_;
      local_288 = AVar4.ignore_check_;
      local_280.amount_ = local_290;
      local_280.ignore_check_ = (bool)local_288;
      iVar3 = cfd::core::Amount::GetSatoshiValue(&local_280);
      *local_30 = iVar3;
    }
  }
  if (local_38 != (undefined8 *)0x0) {
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_2b0,&local_270);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffffc00);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (in_stack_00000008 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxOutReference::GetNonce(&local_2f8,&local_200);
    cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_2d0,&local_2f8);
    local_50 = cfd::capi::CreateString(in_stack_fffffffffffffc00);
    std::__cxx11::string::~string((string *)&local_2d0);
    cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5bdeea);
  }
  if (in_stack_00000010 != (undefined8 *)0x0) {
    cfd::core::AbstractTxOutReference::GetLockingScript
              (&in_stack_fffffffffffffb98->super_AbstractTxOutReference);
    cfd::core::Script::GetHex_abi_cxx11_(&local_318,(Script *)&stack0xfffffffffffffcb0);
    local_58 = cfd::capi::CreateString(in_stack_fffffffffffffc00);
    std::__cxx11::string::~string((string *)&local_318);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffba0);
  }
  if (in_stack_00000018 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxOutReference::GetSurjectionProof(&local_388,&local_200);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_370,&local_388);
    local_60 = cfd::capi::CreateString(in_stack_fffffffffffffc00);
    std::__cxx11::string::~string(local_370);
    cfd::core::ByteData::~ByteData((ByteData *)0x5be070);
  }
  if (in_stack_00000020 != (undefined8 *)0x0) {
    cfd::core::ConfidentialTxOutReference::GetRangeProof(&local_3c0,&local_200);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_3a8,&local_3c0);
    local_68 = cfd::capi::CreateString(in_stack_fffffffffffffc00);
    std::__cxx11::string::~string((string *)&local_3a8);
    cfd::core::ByteData::~ByteData((ByteData *)0x5be133);
  }
  if (local_40 != (char *)0x0) {
    *local_28 = local_40;
  }
  if (local_48 != (char *)0x0) {
    *local_38 = local_48;
  }
  if (local_50 != (char *)0x0) {
    *in_stack_00000008 = local_50;
  }
  if (local_58 != (char *)0x0) {
    *in_stack_00000010 = local_58;
  }
  if (local_60 != (char *)0x0) {
    *in_stack_00000018 = local_60;
  }
  if (local_68 != (char *)0x0) {
    *in_stack_00000020 = local_68;
  }
  local_4 = 0;
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5be24a);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(in_stack_fffffffffffffba0);
  return local_4;
}

Assistant:

int CfdGetConfidentialTxOutByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** asset_string,
    int64_t* value_satoshi, char** value_commitment, char** nonce,
    char** locking_script, char** surjection_proof, char** rangeproof) {
  char* work_asset_string = nullptr;
  char* work_value_commitment = nullptr;
  char* work_nonce = nullptr;
  char* work_locking_script = nullptr;
  char* work_surjection_proof = nullptr;
  char* work_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxOutReference ref = tx->GetTxOut(index);

    if (asset_string != nullptr) {
      work_asset_string = CreateString(ref.GetAsset().GetHex());
    }
    ConfidentialValue value = ref.GetConfidentialValue();
    if ((value_satoshi != nullptr) && (!value.HasBlinding())) {
      *value_satoshi = value.GetAmount().GetSatoshiValue();
    }
    if (value_commitment != nullptr) {
      work_value_commitment = CreateString(value.GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(ref.GetNonce().GetHex());
    }
    if (locking_script != nullptr) {
      work_locking_script = CreateString(ref.GetLockingScript().GetHex());
    }
    if (surjection_proof != nullptr) {
      work_surjection_proof = CreateString(ref.GetSurjectionProof().GetHex());
    }
    if (rangeproof != nullptr) {
      work_rangeproof = CreateString(ref.GetRangeProof().GetHex());
    }

    if (work_asset_string != nullptr) *asset_string = work_asset_string;
    if (work_value_commitment != nullptr)
      *value_commitment = work_value_commitment;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_surjection_proof != nullptr)
      *surjection_proof = work_surjection_proof;
    if (work_rangeproof != nullptr) *rangeproof = work_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}